

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmlinuxalsa.c
# Opt level: O2

PmError alsa_write_short(PmInternal *midi,PmEvent *event)

{
  void *pvVar1;
  uint uVar2;
  PmError PVar3;
  int iVar4;
  undefined1 *puVar5;
  uint uVar6;
  int iVar7;
  bool bVar8;
  
  uVar6 = event->message;
  uVar2 = uVar6 & 0xff;
  iVar4 = 0;
  if (0x7f < uVar2) {
    if (uVar2 < 0xf0) {
      uVar2 = uVar2 - 0x80 >> 4;
      puVar5 = midi_message_length_length;
    }
    else {
      uVar2 = uVar2 - 0xf0;
      puVar5 = midi_message_length_length_7;
    }
    iVar4 = *(int *)(puVar5 + (ulong)uVar2 * 4);
  }
  pvVar1 = midi->descriptor;
  if (pvVar1 == (void *)0x0) {
    PVar3 = pmBadPtr;
  }
  else {
    iVar7 = 0;
    if (0 < iVar4) {
      iVar7 = iVar4;
    }
    while (bVar8 = iVar7 != 0, iVar7 = iVar7 + -1, bVar8) {
      alsa_write_byte(midi,(uchar)uVar6,event->timestamp);
      if (*(int *)((long)pvVar1 + 0x18) < 0) goto LAB_00104409;
      uVar6 = (int)uVar6 >> 8;
    }
    if (*(int *)((long)pvVar1 + 0x18) < 0) {
LAB_00104409:
      PVar3 = pmHostError;
    }
    else {
      *(undefined4 *)((long)pvVar1 + 0x18) = 0;
      PVar3 = pmNoData;
    }
  }
  return PVar3;
}

Assistant:

static PmError alsa_write_short(PmInternal *midi, PmEvent *event)
{
    int bytes = midi_message_length(event->message);
    PmMessage msg = event->message;
    int i;
    alsa_descriptor_type desc = (alsa_descriptor_type) midi->descriptor;
    if (!desc) return pmBadPtr;
    for (i = 0; i < bytes; i++) {
        unsigned char byte = msg;
        VERBOSE printf("sending 0x%x\n", byte);
        alsa_write_byte(midi, byte, event->timestamp);
        if (desc->error < 0) break;
        msg >>= 8; /* shift next byte into position */
    }
    if (desc->error < 0) return pmHostError;
    desc->error = pmNoError;
    return pmNoError;
}